

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O1

Hop_Obj_t * Abc_NodeBuildFromMiniInt(Hop_Man_t *pMan,Vec_Int_t *vAig,int nLeaves)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  
  iVar6 = vAig->nSize;
  uVar3 = (ulong)iVar6;
  if ((long)uVar3 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0x17c,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  piVar2 = vAig->pArray;
  if (1 < piVar2[uVar3 - 1]) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                  ,0x17d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
  }
  if (iVar6 == 2) {
    if (*piVar2 != 0) {
      __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x185,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    if (nLeaves != 1) {
      __assert_fail("nLeaves == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x186,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    pHVar4 = Hop_IthVar(pMan,0);
    if (vAig->nSize < 2) {
LAB_002d232f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pHVar4 = (Hop_Obj_t *)((long)vAig->pArray[1] ^ (ulong)pHVar4);
  }
  else if (iVar6 == 1) {
    if (nLeaves != 0) {
      __assert_fail("nLeaves == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x180,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    pHVar4 = (Hop_Obj_t *)((long)*piVar2 ^ (ulong)pMan->pConst1 ^ 1);
  }
  else {
    if ((uVar3 & 1) == 0) {
      __assert_fail("Vec_IntSize(vAig) & 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x18d,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    iVar6 = vAig->nSize;
    if (iVar6 < 2) {
      uVar8 = 0;
      pHVar4 = (Hop_Obj_t *)0x0;
    }
    else {
      lVar12 = 0;
      uVar10 = 0;
      do {
        piVar2 = vAig->pArray;
        uVar8 = piVar2[lVar12 * 2];
        if (((int)uVar8 < 0) || (uVar1 = piVar2[lVar12 * 2 + 1], (int)uVar1 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar9 = uVar8 >> 1;
        uVar7 = uVar9 - nLeaves;
        if ((int)uVar9 < nLeaves) {
          pHVar4 = Hop_IthVar(pMan,uVar9);
        }
        else {
          if (((int)uVar7 < 0) || (iVar6 <= (int)uVar7)) goto LAB_002d22b3;
          pHVar4 = *(Hop_Obj_t **)(piVar2 + (ulong)uVar7 * 2);
        }
        uVar9 = uVar1 >> 1;
        uVar7 = uVar9 - nLeaves;
        if ((int)uVar9 < nLeaves) {
          pHVar5 = Hop_IthVar(pMan,uVar9);
        }
        else {
          if (((int)uVar7 < 0) || (vAig->nSize <= (int)uVar7)) {
LAB_002d22b3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pHVar5 = *(Hop_Obj_t **)(vAig->pArray + (ulong)uVar7 * 2);
        }
        pHVar4 = Hop_And(pMan,(Hop_Obj_t *)((ulong)pHVar4 ^ (ulong)(uVar8 & 1)),
                         (Hop_Obj_t *)((ulong)(uVar1 & 1) ^ (ulong)pHVar5));
        if (vAig->nSize <= (int)lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        *(Hop_Obj_t **)(vAig->pArray + lVar12 * 2) = pHVar4;
        iVar6 = vAig->nSize;
        lVar12 = lVar12 + 1;
        uVar8 = uVar10 + 2;
        iVar11 = uVar10 + 3;
        uVar10 = uVar8;
      } while (iVar11 < iVar6);
    }
    if (uVar8 != iVar6 - 1U) {
      __assert_fail("i == Vec_IntSize(vAig) - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                    ,0x198,"Hop_Obj_t *Abc_NodeBuildFromMiniInt(Hop_Man_t *, Vec_Int_t *, int)");
    }
    if (iVar6 <= (int)uVar8) goto LAB_002d232f;
    pHVar4 = (Hop_Obj_t *)((ulong)pHVar4 ^ (long)vAig->pArray[uVar8]);
    vAig->nSize = 0;
  }
  return pHVar4;
}

Assistant:

Hop_Obj_t * Abc_NodeBuildFromMiniInt( Hop_Man_t * pMan, Vec_Int_t * vAig, int nLeaves )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
    {
        assert( nLeaves == 0 );
        return Hop_NotCond( Hop_ManConst0(pMan), Vec_IntEntry(vAig, 0) );
    }
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( nLeaves == 1 );
        return Hop_NotCond( Hop_IthVar(pMan, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int i, iVar0, iVar1, iLit0, iLit1;
        Hop_Obj_t * piLit0, * piLit1, * piLit = NULL;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            piLit0 = Hop_NotCond( iVar0 < nLeaves ? Hop_IthVar(pMan, iVar0) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            piLit1 = Hop_NotCond( iVar1 < nLeaves ? Hop_IthVar(pMan, iVar1) : (Hop_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            piLit  = Hop_And( pMan, piLit0, piLit1 );
            assert( (i & 1) == 0 );
            Vec_PtrWriteEntry( (Vec_Ptr_t *)vAig, Abc_Lit2Var(i), piLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        piLit = Hop_NotCond( piLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return piLit;
    }
}